

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

FaceData * __thiscall
Ptex::v2_4::PtexReader::PackedFace::reduce
          (PackedFace *this,PtexReader *r,Res newres,ReduceFn *reducefn,size_t *newMemUsed)

{
  undefined8 uVar1;
  DataType DVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FaceData *pFVar9;
  code *in_RCX;
  PtexReader *in_RSI;
  long in_RDI;
  long *in_R8;
  PackedFace *pf;
  int memsize;
  int nchan;
  DataType dt;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  Res resArg;
  _func_int **pp_Var10;
  Res local_2;
  
  resArg = SUB82((ulong)in_stack_ffffffffffffff80 >> 0x30,0);
  DVar2 = datatype(in_RSI);
  iVar3 = nchannels(in_RSI);
  iVar5 = *(int *)(in_RDI + 0xc);
  iVar4 = Res::size((Res *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  pFVar9 = (FaceData *)operator_new(0x18);
  PackedFace((PackedFace *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),resArg,
             in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  *in_R8 = (long)(iVar5 * iVar4) + 0x18;
  uVar1 = *(undefined8 *)(in_RDI + 0x10);
  iVar5 = *(int *)(in_RDI + 0xc);
  iVar4 = Res::u((Res *)(in_RDI + 8));
  iVar5 = iVar5 * iVar4;
  iVar6 = Res::u((Res *)(in_RDI + 8));
  iVar7 = Res::v((Res *)(in_RDI + 8));
  pp_Var10 = pFVar9[1].super_PtexFaceData._vptr_PtexFaceData;
  iVar4 = *(int *)(in_RDI + 0xc);
  iVar8 = Res::u(&local_2);
  (*in_RCX)(uVar1,iVar5,iVar6,iVar7,pp_Var10,iVar4 * iVar8,DVar2,iVar3);
  return pFVar9;
}

Assistant:

PtexReader::FaceData*
PtexReader::PackedFace::reduce(PtexReader* r, Res newres, PtexUtils::ReduceFn reducefn,
                               size_t& newMemUsed)
{
    // allocate a new face and reduce image
    DataType dt = r->datatype();
    int nchan = r->nchannels();
    int memsize = _pixelsize * newres.size();
    PackedFace* pf = new PackedFace(newres, _pixelsize, memsize);
    newMemUsed = sizeof(PackedFace) + memsize;
    // reduce and copy into new face
    reducefn(_data, _pixelsize * _res.u(), _res.u(), _res.v(),
             pf->_data, _pixelsize * newres.u(), dt, nchan);
    return pf;
}